

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void PatternMatch_TypeDecl(KonohaContext *kctx,KonohaStack *sfp)

{
  int endIdx;
  kToken *node;
  kArray *tokenList;
  int iVar1;
  int iVar2;
  kNameSpace *ns;
  uintptr_t uVar3;
  KClass *foundClass;
  
  node = sfp[1].field_0.asToken;
  tokenList = sfp[3].field_0.asArray;
  iVar2 = *(int *)&sfp[4].field_1;
  endIdx = *(int *)&sfp[6].field_1;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"PatternMatch_TypeDecl",0x7f,"tracing..");
  ns = kNode_GetNameSpace(kctx,(kNode *)node);
  foundClass = (KClass *)0x0;
  iVar1 = ParseTypePattern(kctx,ns,tokenList,iVar2,endIdx,&foundClass);
  uVar3 = 0xffffffffffffffff;
  if (iVar1 != -1) {
    iVar1 = TokenUtils_SkipIndent(tokenList,iVar1,endIdx);
    if ((iVar1 < endIdx) && (*(int *)((tokenList->field_2).unboxItems[iVar1] + 0x28) == -0x1ffffffe)
       ) {
      iVar2 = ParseSyntaxPattern(kctx,ns,(kNode *)node,
                                 ((anon_union_8_4_68c56b00_for_kNodeVar_9 *)
                                 &node->resolvedSyntaxInfo)->syn,tokenList,iVar2,endIdx);
      uVar3 = (uintptr_t)iVar2;
    }
  }
  sfp[-4].field_1.unboxValue = uVar3;
  return;
}

Assistant:

static KMETHOD PatternMatch_TypeDecl(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_PatternMatch(stmt, name, tokenList, beginIdx, endIdx);
	kNameSpace *ns = kNode_ns(stmt);
	KClass *foundClass = NULL;
	int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
	//DBG_P("@ nextIdx = %d < %d", nextIdx, endIdx);
	if(nextIdx != -1) {
		nextIdx = TokenUtils_SkipIndent(tokenList, nextIdx, endIdx);
		if(nextIdx < endIdx) {
			kToken *tk = tokenList->TokenItems[nextIdx];
			if(tk->tokenType == KSymbol_SymbolPattern) {
				KReturnUnboxValue(ParseSyntaxPattern(kctx, ns, stmt, stmt->syn, tokenList, beginIdx, endIdx));
			}
		}
	}
	KReturnUnboxValue(-1);
}